

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O0

hrgls_DataBlob __thiscall hrgls::datablob::DataBlob::RawDataBlob(DataBlob *this)

{
  hrgls_DataBlob ret;
  DataBlob *this_local;
  
  if (this->m_private == (DataBlob_private *)0x0) {
    this_local = (DataBlob *)0x0;
  }
  else if (this->m_private->blob == (hrgls_DataBlob)0x0) {
    this->m_private->status = 0x3ee;
    this_local = (DataBlob *)0x0;
  }
  else {
    this->m_private->status = 0;
    this_local = (DataBlob *)this->m_private->blob;
  }
  return (hrgls_DataBlob)this_local;
}

Assistant:

hrgls_DataBlob const DataBlob::RawDataBlob() const
    {
      hrgls_DataBlob ret = nullptr;
      if (!m_private) {
        return ret;
      }
      if (!m_private->blob) {
        m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
        return ret;
      }
      m_private->status = hrgls_STATUS_OKAY;
      return m_private->blob;
    }